

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoprintf.h
# Opt level: O3

int npf_vpprintf(npf_putc pc,void *pc_ctx,char *format,__va_list_tag *args)

{
  byte bVar1;
  bool bVar2;
  void *pvVar3;
  int *piVar4;
  ulong uVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  uint *puVar9;
  int iVar10;
  uint uVar11;
  uint *puVar12;
  byte *pbVar13;
  uint *puVar14;
  uint uVar15;
  uint uVar16;
  uint *in_R9;
  byte bVar17;
  undefined4 uVar18;
  char cVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  anon_union_24_2_9e8356ad u;
  int local_b8;
  undefined8 local_98;
  char cStack_90;
  undefined7 uStack_8f;
  undefined8 local_78;
  byte bStack_70;
  void *local_68;
  npf_putc local_60;
  byte *local_58;
  int iStack_4c;
  __va_list_tag *local_48;
  byte *local_40;
  
  local_48 = args;
  iVar21 = 0;
  local_68 = pc_ctx;
  local_60 = pc;
  do {
    pvVar3 = local_68;
    bVar17 = *format;
    local_58 = (byte *)format;
    if (bVar17 != 0x25) {
      if (bVar17 == 0) {
        return iVar21;
      }
      goto switchD_00101387_caseD_59;
    }
    cVar6 = '\0';
    uVar18 = 0;
    uVar5 = 0;
    pbVar13 = (byte *)format;
    uVar16 = 0;
    uVar11 = 0;
LAB_0010119c:
    while( true ) {
      while( true ) {
        cVar19 = (char)uVar16;
        in_R9 = (uint *)CONCAT71((int7)((ulong)in_R9 >> 8),(char)uVar11 == '\0');
        puVar12 = (uint *)(pbVar13 + 2);
        while( true ) {
          bVar1 = *(byte *)((long)puVar12 + -1);
          uVar15 = (uint)bVar1;
          if (bVar1 != 0x30) break;
          puVar12 = (uint *)((long)puVar12 + 1);
          uVar5 = (ulong)in_R9 & 0xffffffff;
        }
        if (bVar1 < 0x2a) break;
        if (bVar1 == 0x2a) {
          uVar15 = (uint)(byte)*puVar12;
          bVar7 = false;
          bVar2 = true;
          goto LAB_0010125e;
        }
        if (bVar1 == 0x2b) {
          cVar6 = '+';
          goto LAB_00101210;
        }
        if (bVar1 != 0x2d) goto LAB_00101223;
        pbVar13 = (byte *)((long)puVar12 + -1);
        uVar5 = 0;
        uVar16 = uVar15;
        uVar11 = uVar15;
      }
      if (bVar1 != 0x20) break;
      if (cVar6 == '\0') {
        cVar6 = ' ';
      }
LAB_00101210:
      pbVar13 = (byte *)((long)puVar12 + -1);
    }
    if (bVar1 == 0x23) {
      pbVar13 = (byte *)((long)puVar12 + -1);
      uVar18 = 0x23;
      goto LAB_0010119c;
    }
LAB_00101223:
    puVar12 = (uint *)((long)puVar12 + -1);
    if ((byte)(bVar1 - 0x30) < 10) {
      iVar10 = 0;
      do {
        iVar10 = uVar15 + iVar10 * 10 + -0x30;
        pbVar13 = (byte *)((long)puVar12 + 1);
        uVar15 = (uint)*pbVar13;
        puVar12 = (uint *)((long)puVar12 + 1);
      } while ((byte)(*pbVar13 - 0x30) < 10);
      bVar2 = false;
      bVar7 = false;
    }
    else {
      bVar2 = false;
      bVar7 = true;
LAB_0010125e:
      iVar10 = 0;
    }
    local_78 = CONCAT44(local_78._4_4_,(uint)uVar5);
    iVar20 = 0;
    local_98 = CONCAT44(local_98._4_4_,uVar18);
    if ((char)uVar15 == '.') {
      bVar1 = *(byte *)((long)puVar12 + 1);
      if (bVar1 == 0x2d) {
        bVar1 = *(byte *)((long)puVar12 + 2);
        puVar12 = (uint *)((long)puVar12 + 2);
        cVar6 = '\0';
      }
      else {
        if (bVar1 == 0x2a) {
          uVar15 = (uint)*(byte *)((long)puVar12 + 2);
          puVar12 = (uint *)((long)puVar12 + 2);
          cVar6 = '\x02';
          iVar20 = 0;
          goto LAB_001012d2;
        }
        puVar12 = (uint *)((long)puVar12 + 1);
        cVar6 = '\x01';
      }
      uVar15 = (uint)bVar1;
      if ((byte)(bVar1 - 0x30) < 10) {
        iVar20 = 0;
        do {
          iVar20 = (uint)(byte)((char)uVar15 - 0x30) + iVar20 * 10;
          pbVar13 = (byte *)((long)puVar12 + 1);
          uVar15 = (uint)*pbVar13;
          puVar12 = (uint *)((long)puVar12 + 1);
        } while ((byte)(*pbVar13 - 0x30) < 10);
      }
    }
    else {
      cVar6 = '\0';
    }
LAB_001012d2:
    puVar14 = (uint *)((long)puVar12 + 1);
    puVar9 = puVar14;
    if (uVar15 < 0x6c) {
      if (uVar15 == 0x4c) goto LAB_00101355;
      if (uVar15 == 0x68) {
        uVar15 = (uint)*(byte *)puVar14;
        if (*(byte *)puVar14 == 0x68) goto LAB_0010134d;
      }
      else {
        puVar9 = puVar12;
        if (uVar15 == 0x6a) goto LAB_00101355;
      }
    }
    else if (uVar15 == 0x6c) {
      uVar15 = (uint)*(byte *)puVar14;
      if (*(byte *)puVar14 == 0x6c) {
LAB_0010134d:
        puVar14 = (uint *)((long)puVar12 + 2);
        goto LAB_00101355;
      }
    }
    else if ((uVar15 == 0x74) || (puVar9 = puVar12, uVar15 == 0x7a)) {
LAB_00101355:
      uVar15 = (uint)(byte)*puVar14;
      puVar9 = puVar14;
    }
    local_b8 = 7;
    in_R9 = &switchD_00101387::switchdataD_0010302c;
    switch(uVar15) {
    case 0x58:
    case 0x78:
switchD_00101387_caseD_78:
      uVar16 = (uint)uVar5 & 0xff;
      if (cVar6 != '\0') {
        uVar16 = 0;
      }
      local_78 = CONCAT44(local_78._4_4_,uVar16);
      break;
    case 0x59:
    case 0x5a:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x60:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x76:
    case 0x77:
      goto switchD_00101387_caseD_59;
    case 0x61:
switchD_00101387_caseD_61:
      if (cVar6 == '\0') {
        iVar20 = 6;
      }
      local_b8 = 0xe;
      break;
    case 0x62:
      local_b8 = 5;
      break;
    case 99:
      local_b8 = 2;
      goto LAB_001013ff;
    case 100:
    case 0x69:
      local_b8 = 4;
      goto switchD_00101387_caseD_78;
    case 0x65:
switchD_00101387_caseD_65:
      if (cVar6 == '\0') {
        iVar20 = 6;
      }
      local_b8 = 0xc;
      break;
    case 0x66:
switchD_00101387_caseD_66:
      if (cVar6 == '\0') {
        iVar20 = 6;
      }
      local_b8 = 0xb;
      break;
    case 0x67:
switchD_00101387_caseD_67:
      if (cVar6 == '\0') {
        iVar20 = 6;
      }
      local_b8 = 0xd;
      break;
    case 0x6e:
      local_b8 = 10;
      goto LAB_001013ff;
    case 0x6f:
      local_b8 = 6;
      goto switchD_00101387_caseD_78;
    case 0x70:
      local_b8 = 9;
LAB_001013ff:
      cVar6 = '\0';
      break;
    case 0x73:
      local_b8 = 3;
      local_78 = (ulong)local_78._4_4_ << 0x20;
      break;
    case 0x75:
      local_b8 = 8;
      goto switchD_00101387_caseD_78;
    default:
      in_R9 = &switchD_001013a9::switchdataD_00103010;
      switch(uVar15) {
      case 0x41:
        goto switchD_00101387_caseD_61;
      case 0x42:
        local_b8 = 5;
        goto LAB_00101478;
      case 0x43:
      case 0x44:
        break;
      case 0x45:
        goto switchD_00101387_caseD_65;
      case 0x46:
        goto switchD_00101387_caseD_66;
      case 0x47:
        goto switchD_00101387_caseD_67;
      default:
        in_R9 = puVar14;
        if (uVar15 == 0x25) {
          local_b8 = 1;
          goto LAB_001013ff;
        }
      }
      goto switchD_00101387_caseD_59;
    }
LAB_00101478:
    local_40 = (byte *)((long)puVar9 + (1 - (long)format));
    if ((int)local_40 == 0) {
switchD_00101387_caseD_59:
      format = (char *)((byte *)format + 1);
      iVar21 = iVar21 + 1;
      (*pc)((int)(char)bVar17,pc_ctx);
    }
    else {
      if (bVar2) {
        uVar16 = local_48->gp_offset;
        if ((ulong)uVar16 < 0x29) {
          piVar4 = (int *)((ulong)uVar16 + (long)local_48->reg_save_area);
          local_48->gp_offset = uVar16 + 8;
        }
        else {
          piVar4 = (int *)local_48->overflow_arg_area;
          local_48->overflow_arg_area = piVar4 + 2;
        }
        iVar8 = *piVar4;
        if (iVar8 < 0) {
          cVar19 = '\x01';
        }
        iVar10 = -iVar8;
        if (0 < iVar8) {
          iVar10 = iVar8;
        }
      }
      if (cVar6 == '\x02') {
        uVar16 = local_48->gp_offset;
        if ((ulong)uVar16 < 0x29) {
          piVar4 = (int *)((ulong)uVar16 + (long)local_48->reg_save_area);
          local_48->gp_offset = uVar16 + 8;
        }
        else {
          piVar4 = (int *)local_48->overflow_arg_area;
          local_48->overflow_arg_area = piVar4 + 2;
        }
        iVar20 = *piVar4;
      }
      cStack_90 = '%';
      in_R9 = (uint *)0x0;
      if (bVar7) {
        bVar2 = false;
        bVar17 = 1;
        iVar8 = 0;
      }
      else {
        bVar17 = 1;
        iVar8 = 0;
        if ((char)local_78 == '\0') {
          iVar8 = 0x20;
          bVar2 = true;
        }
        else if ((byte)((char)local_b8 - 4U) < 0xfd) {
          bVar17 = 0;
          iVar8 = 0x30;
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
      }
      if ((0xb < (byte)(local_b8 - 3U)) ||
         (local_98 = 0, (0xf01U >> (local_b8 - 3U & 0x1f) & 1) == 0)) {
        uVar16 = iVar20 - 1U;
        if ((int)(iVar20 - 1U) < 1) {
          uVar16 = 0;
        }
        local_98 = (ulong)uVar16;
      }
      uVar16 = (iVar10 + -1) - (int)local_98;
      uVar5 = 0;
      if (0 < (int)uVar16) {
        uVar5 = (ulong)uVar16;
      }
      local_78 = uVar5;
      if (bVar2 && cVar19 == '\0') {
        iStack_4c = 0;
        bStack_70 = bVar17;
        iStack_4c = 0;
        cStack_90 = '%';
        in_R9 = (uint *)0x0;
        if (0 < (int)uVar16) {
          do {
            (*pc)(iVar8,pvVar3);
            uVar16 = (int)uVar5 - 1;
            uVar5 = (ulong)uVar16;
          } while (uVar16 != 0);
          iVar21 = iVar21 + (int)local_78;
        }
        iVar10 = iStack_4c;
        pvVar3 = local_68;
        local_78 = 0xffffffff;
        if ((iStack_4c != 0 & bStack_70) != 0) {
          (*local_60)(0x30,local_68);
          pc = local_60;
          iVar21 = iVar21 + 2;
          (*local_60)(iVar10,pvVar3);
        }
      }
      pc_ctx = local_68;
      if ((char)local_b8 == '\x03') {
        if (&cStack_90 != (char *)0x0) {
          lVar22 = 0;
          do {
            (*pc)((int)(&cStack_90)[lVar22],pc_ctx);
            lVar22 = lVar22 + 1;
          } while (lVar22 == 0);
          iVar21 = iVar21 + (int)lVar22;
        }
      }
      else {
        iVar10 = (int)local_98;
        if (iVar10 != 0) {
          iVar10 = iVar10 + 1;
          do {
            (*pc)(0x30,pc_ctx);
            iVar10 = iVar10 + -1;
          } while (1 < iVar10);
          iVar10 = (int)local_98;
        }
        if ((char)local_b8 == '\x05') {
          uVar5 = 1;
          do {
            uVar5 = uVar5 - 1;
            (*pc)(((CONCAT71(uStack_8f,cStack_90) >> (uVar5 & 0x3f) & 1) != 0) + 0x30,pc_ctx);
          } while (uVar5 != 0);
          iVar21 = iVar10 + 1 + iVar21;
        }
        else {
          uVar5 = 2;
          do {
            (*pc)((int)*(char *)((long)&local_98 + uVar5 + 6),pc_ctx);
            uVar5 = uVar5 - 1;
          } while (1 < uVar5);
          iVar21 = iVar10 + 1 + iVar21;
        }
      }
      iVar10 = (int)local_78;
      if ((bool)((0 < iVar10 && cVar19 != '\0') & bVar2)) {
        uVar16 = iVar10 + 1;
        do {
          (*pc)(iVar8,pc_ctx);
          uVar16 = uVar16 - 1;
        } while (1 < uVar16);
        iVar21 = iVar21 + iVar10;
      }
      format = (char *)(local_58 + (int)local_40);
    }
  } while( true );
}

Assistant:

int npf_vpprintf(npf_putc pc, void *pc_ctx, char const *format, va_list args) {
  npf_format_spec_t fs;
  char const *cur = format;
  npf_cnt_putc_ctx_t pc_cnt;
  pc_cnt.pc = pc;
  pc_cnt.ctx = pc_ctx;
  pc_cnt.n = 0;

  while (*cur) {
    int const fs_len = (*cur != '%') ? 0 : npf_parse_format_spec(cur, &fs);
    if (!fs_len) { NPF_PUTC(*cur++); continue; }
    cur += fs_len;

    // Extract star-args immediately
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    if (fs.field_width_opt == NPF_FMT_SPEC_OPT_STAR) {
      fs.field_width = va_arg(args, int);
      if (fs.field_width < 0) {
        fs.field_width = -fs.field_width;
        fs.left_justified = 1;
      }
    }
#endif
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
    if (fs.prec_opt == NPF_FMT_SPEC_OPT_STAR) {
      fs.prec = va_arg(args, int);
      if (fs.prec < 0) { fs.prec_opt = NPF_FMT_SPEC_OPT_NONE; }
    }
#endif

    union { char cbuf_mem[NANOPRINTF_CONVERSION_BUFFER_SIZE]; npf_uint_t binval; } u;
    char *cbuf = u.cbuf_mem, sign_c = 0;
    int cbuf_len = 0, need_0x = 0;
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    int field_pad = 0;
    char pad_c = 0;
#endif
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
    int prec_pad = 0;
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    int zero = 0;
#endif
#endif

    // Extract and convert the argument to string, point cbuf at the text.
    switch (fs.conv_spec) {
      case NPF_FMT_SPEC_CONV_PERCENT:
        *cbuf = '%';
        cbuf_len = 1;
        break;

      case NPF_FMT_SPEC_CONV_CHAR:
        *cbuf = (char)va_arg(args, int);
        cbuf_len = 1;
        break;

      case NPF_FMT_SPEC_CONV_STRING: {
        cbuf = va_arg(args, char *);
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
        for (char const *s = cbuf;
             ((fs.prec_opt == NPF_FMT_SPEC_OPT_NONE) || (cbuf_len < fs.prec)) && cbuf && *s;
             ++s, ++cbuf_len);
#else
        for (char const *s = cbuf; cbuf && *s; ++s, ++cbuf_len); // strlen
#endif
      } break;

      case NPF_FMT_SPEC_CONV_SIGNED_INT: {
        npf_int_t val = 0;
        switch (fs.length_modifier) {
          NPF_EXTRACT(NONE, int, int);
          NPF_EXTRACT(SHORT, short, int);
          NPF_EXTRACT(LONG_DOUBLE, int, int);
          NPF_EXTRACT(CHAR, signed char, int);
          NPF_EXTRACT(LONG, long, long);
#if NANOPRINTF_USE_LARGE_FORMAT_SPECIFIERS == 1
          NPF_EXTRACT(LARGE_LONG_LONG, long long, long long);
          NPF_EXTRACT(LARGE_INTMAX, intmax_t, intmax_t);
          NPF_EXTRACT(LARGE_SIZET, npf_ssize_t, npf_ssize_t);
          NPF_EXTRACT(LARGE_PTRDIFFT, ptrdiff_t, ptrdiff_t);
#endif
          default: break;
        }

        sign_c = (val < 0) ? '-' : fs.prepend;

#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
        zero = !val;
#endif
        // special case, if prec and value are 0, skip
        if (!val && (fs.prec_opt != NPF_FMT_SPEC_OPT_NONE) && !fs.prec) {
          cbuf_len = 0;
        } else
#endif
        {
          npf_uint_t uval = (npf_uint_t)val;
          if (val < 0) { uval = 0 - uval; }
          cbuf_len = npf_utoa_rev(uval, cbuf, 10, fs.case_adjust);
        }
      } break;

#if NANOPRINTF_USE_BINARY_FORMAT_SPECIFIERS == 1
      case NPF_FMT_SPEC_CONV_BINARY:
#endif
      case NPF_FMT_SPEC_CONV_OCTAL:
      case NPF_FMT_SPEC_CONV_HEX_INT:
      case NPF_FMT_SPEC_CONV_UNSIGNED_INT: {
        npf_uint_t val = 0;

        switch (fs.length_modifier) {
          NPF_EXTRACT(NONE, unsigned, unsigned);
          NPF_EXTRACT(SHORT, unsigned short, unsigned);
          NPF_EXTRACT(LONG_DOUBLE, unsigned, unsigned);
          NPF_EXTRACT(CHAR, unsigned char, unsigned);
          NPF_EXTRACT(LONG, unsigned long, unsigned long);
#if NANOPRINTF_USE_LARGE_FORMAT_SPECIFIERS == 1
          NPF_EXTRACT(LARGE_LONG_LONG, unsigned long long, unsigned long long);
          NPF_EXTRACT(LARGE_INTMAX, uintmax_t, uintmax_t);
          NPF_EXTRACT(LARGE_SIZET, size_t, size_t);
          NPF_EXTRACT(LARGE_PTRDIFFT, size_t, size_t);
#endif
          default: break;
        }

#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
        zero = !val;
#endif
        if (!val && (fs.prec_opt != NPF_FMT_SPEC_OPT_NONE) && !fs.prec) {
          // Zero value and explicitly-requested zero precision means "print nothing".
          if ((fs.conv_spec == NPF_FMT_SPEC_CONV_OCTAL) && fs.alt_form) {
            fs.prec = 1; // octal special case, print a single '0'
          }
        } else
#endif
#if NANOPRINTF_USE_BINARY_FORMAT_SPECIFIERS == 1
        if (fs.conv_spec == NPF_FMT_SPEC_CONV_BINARY) {
          cbuf_len = npf_bin_len(val); u.binval = val;
        } else
#endif
        {
          uint_fast8_t const base = (fs.conv_spec == NPF_FMT_SPEC_CONV_OCTAL) ?
            8u : ((fs.conv_spec == NPF_FMT_SPEC_CONV_HEX_INT) ? 16u : 10u);
          cbuf_len = npf_utoa_rev(val, cbuf, base, fs.case_adjust);
        }

        if (val && fs.alt_form && (fs.conv_spec == NPF_FMT_SPEC_CONV_OCTAL)) {
          cbuf[cbuf_len++] = '0'; // OK to add leading octal '0' immediately.
        }

        if (val && fs.alt_form) { // 0x or 0b but can't write it yet.
          if (fs.conv_spec == NPF_FMT_SPEC_CONV_HEX_INT) { need_0x = 'X'; }
#if NANOPRINTF_USE_BINARY_FORMAT_SPECIFIERS == 1
          else if (fs.conv_spec == NPF_FMT_SPEC_CONV_BINARY) { need_0x = 'B'; }
#endif
          if (need_0x) { need_0x += fs.case_adjust; }
        }
      } break;

      case NPF_FMT_SPEC_CONV_POINTER: {
        cbuf_len =
          npf_utoa_rev((npf_uint_t)(uintptr_t)va_arg(args, void *), cbuf, 16, 'a' - 'A');
        need_0x = 'x';
      } break;

#if NANOPRINTF_USE_WRITEBACK_FORMAT_SPECIFIERS == 1
      case NPF_FMT_SPEC_CONV_WRITEBACK:
        switch (fs.length_modifier) {
          NPF_WRITEBACK(NONE, int);
          NPF_WRITEBACK(SHORT, short);
          NPF_WRITEBACK(LONG, long);
          NPF_WRITEBACK(LONG_DOUBLE, double);
          NPF_WRITEBACK(CHAR, signed char);
#if NANOPRINTF_USE_LARGE_FORMAT_SPECIFIERS == 1
          NPF_WRITEBACK(LARGE_LONG_LONG, long long);
          NPF_WRITEBACK(LARGE_INTMAX, intmax_t);
          NPF_WRITEBACK(LARGE_SIZET, size_t);
          NPF_WRITEBACK(LARGE_PTRDIFFT, ptrdiff_t);
#endif
          default: break;
        } break;
#endif

#if NANOPRINTF_USE_FLOAT_FORMAT_SPECIFIERS == 1
      case NPF_FMT_SPEC_CONV_FLOAT_DEC:
      case NPF_FMT_SPEC_CONV_FLOAT_SCI:
      case NPF_FMT_SPEC_CONV_FLOAT_SHORTEST:
      case NPF_FMT_SPEC_CONV_FLOAT_HEX: {
        double val;
        if (fs.length_modifier == NPF_FMT_SPEC_LEN_MOD_LONG_DOUBLE) {
          val = (double)va_arg(args, long double);
        } else {
          val = va_arg(args, double);
        }

        sign_c = (val < 0.) ? '-' : fs.prepend;
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
        zero = (val == 0.);
#endif
        cbuf_len = npf_ftoa_rev(cbuf, &fs, val);
      } break;
#endif
      default: break;
    }

#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    // Compute the field width pad character
    if (fs.field_width_opt != NPF_FMT_SPEC_OPT_NONE) {
      if (fs.leading_zero_pad) { // '0' flag is only legal with numeric types
        if ((fs.conv_spec != NPF_FMT_SPEC_CONV_STRING) &&
            (fs.conv_spec != NPF_FMT_SPEC_CONV_CHAR) &&
            (fs.conv_spec != NPF_FMT_SPEC_CONV_PERCENT)) {
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
          if ((fs.prec_opt != NPF_FMT_SPEC_OPT_NONE) && !fs.prec && zero) {
            pad_c = ' ';
          } else
#endif
          { pad_c = '0'; }
        }
      } else { pad_c = ' '; }
    }
#endif

    // Compute the number of bytes to truncate or '0'-pad.
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
    if (fs.conv_spec != NPF_FMT_SPEC_CONV_STRING) {
#if NANOPRINTF_USE_FLOAT_FORMAT_SPECIFIERS == 1
      // float precision is after the decimal point
      if ((fs.conv_spec != NPF_FMT_SPEC_CONV_FLOAT_DEC) &&
          (fs.conv_spec != NPF_FMT_SPEC_CONV_FLOAT_SCI) &&
          (fs.conv_spec != NPF_FMT_SPEC_CONV_FLOAT_SHORTEST) &&
          (fs.conv_spec != NPF_FMT_SPEC_CONV_FLOAT_HEX))
#endif
      { prec_pad = npf_max(0, fs.prec - cbuf_len); }
    }
#endif

#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    // Given the full converted length, how many pad bytes?
    field_pad = fs.field_width - cbuf_len - !!sign_c;
    if (need_0x) { field_pad -= 2; }
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
    field_pad -= prec_pad;
#endif
    field_pad = npf_max(0, field_pad);

    // Apply right-justified field width if requested
    if (!fs.left_justified && pad_c) { // If leading zeros pad, sign goes first.
      if (pad_c == '0') {
        if (sign_c) { NPF_PUTC(sign_c); sign_c = 0; }
        // Pad byte is '0', write '0x' before '0' pad chars.
        if (need_0x) { NPF_PUTC('0'); NPF_PUTC(need_0x); }
      }
      while (field_pad-- > 0) { NPF_PUTC(pad_c); }
      // Pad byte is ' ', write '0x' after ' ' pad chars but before number.
      if ((pad_c != '0') && need_0x) { NPF_PUTC('0'); NPF_PUTC(need_0x); }
    } else
#endif
    { if (need_0x) { NPF_PUTC('0'); NPF_PUTC(need_0x); } } // no pad, '0x' requested.

    // Write the converted payload
    if (fs.conv_spec == NPF_FMT_SPEC_CONV_STRING) {
      for (int i = 0; cbuf && (i < cbuf_len); ++i) { NPF_PUTC(cbuf[i]); }
    } else {
      if (sign_c) { NPF_PUTC(sign_c); }
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
      while (prec_pad-- > 0) { NPF_PUTC('0'); } // int precision leads.
#endif
#if NANOPRINTF_USE_BINARY_FORMAT_SPECIFIERS == 1
      if (fs.conv_spec == NPF_FMT_SPEC_CONV_BINARY) {
        while (cbuf_len) { NPF_PUTC('0' + ((u.binval >> --cbuf_len) & 1)); }
      } else
#endif
      { while (cbuf_len-- > 0) { NPF_PUTC(cbuf[cbuf_len]); } } // payload is reversed
    }

#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    if (fs.left_justified && pad_c) { // Apply left-justified field width
      while (field_pad-- > 0) { NPF_PUTC(pad_c); }
    }
#endif
  }

  return pc_cnt.n;
}